

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common_expression_delete.hpp
# Opt level: O2

bool __thiscall optimization::common_expr_del::Node::operator<(Node *this,Node *other)

{
  Op *__v;
  Op *__v_00;
  byte bVar1;
  byte bVar2;
  __index_type _Var3;
  variant_alternative_t<0UL,_variant<Op,_ExtraNormOp,_InNormOp>_> vVar4;
  variant_alternative_t<1UL,_variant<Op,_ExtraNormOp,_InNormOp>_> vVar5;
  bool bVar6;
  variant_alternative_t<0UL,_variant<Op,_ExtraNormOp,_InNormOp>_> *pvVar7;
  variant_alternative_t<2UL,_variant<Op,_ExtraNormOp,_InNormOp>_> *pvVar8;
  variant_alternative_t<1UL,_variant<Op,_ExtraNormOp,_InNormOp>_> *pvVar9;
  variant_alternative_t<2UL,_variant<Op,_ExtraNormOp,_InNormOp>_> vVar10;
  vector<std::variant<int,_optimization::common_expr_del::NodeId,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::variant<int,_optimization::common_expr_del::NodeId,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  reverse_operands;
  vector<std::variant<int,_optimization::common_expr_del::NodeId,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::variant<int,_optimization::common_expr_del::NodeId,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_40;
  
  if (this->is_leaf != other->is_leaf) {
    return this->is_leaf < other->is_leaf;
  }
  bVar1 = *(__index_type *)
           ((long)&(this->op).
                   super__Variant_base<mir::inst::Op,_optimization::common_expr_del::ExtraNormOp,_optimization::common_expr_del::InNormOp>
                   .
                   super__Move_assign_alias<mir::inst::Op,_optimization::common_expr_del::ExtraNormOp,_optimization::common_expr_del::InNormOp>
                   .
                   super__Copy_assign_alias<mir::inst::Op,_optimization::common_expr_del::ExtraNormOp,_optimization::common_expr_del::InNormOp>
                   .
                   super__Move_ctor_alias<mir::inst::Op,_optimization::common_expr_del::ExtraNormOp,_optimization::common_expr_del::InNormOp>
                   .
                   super__Copy_ctor_alias<mir::inst::Op,_optimization::common_expr_del::ExtraNormOp,_optimization::common_expr_del::InNormOp>
                   .
                   super__Variant_storage_alias<mir::inst::Op,_optimization::common_expr_del::ExtraNormOp,_optimization::common_expr_del::InNormOp>
           + 4);
  bVar2 = *(__index_type *)
           ((long)&(other->op).
                   super__Variant_base<mir::inst::Op,_optimization::common_expr_del::ExtraNormOp,_optimization::common_expr_del::InNormOp>
                   .
                   super__Move_assign_alias<mir::inst::Op,_optimization::common_expr_del::ExtraNormOp,_optimization::common_expr_del::InNormOp>
                   .
                   super__Copy_assign_alias<mir::inst::Op,_optimization::common_expr_del::ExtraNormOp,_optimization::common_expr_del::InNormOp>
                   .
                   super__Move_ctor_alias<mir::inst::Op,_optimization::common_expr_del::ExtraNormOp,_optimization::common_expr_del::InNormOp>
                   .
                   super__Copy_ctor_alias<mir::inst::Op,_optimization::common_expr_del::ExtraNormOp,_optimization::common_expr_del::InNormOp>
                   .
                   super__Variant_storage_alias<mir::inst::Op,_optimization::common_expr_del::ExtraNormOp,_optimization::common_expr_del::InNormOp>
           + 4);
  if (bVar1 != bVar2) {
    return bVar1 < bVar2;
  }
  __v = &this->op;
  __v_00 = &other->op;
  if (bVar1 == 1) {
    pvVar9 = std::
             get<1ul,mir::inst::Op,optimization::common_expr_del::ExtraNormOp,optimization::common_expr_del::InNormOp>
                       (__v);
    vVar5 = *pvVar9;
    pvVar9 = std::
             get<1ul,mir::inst::Op,optimization::common_expr_del::ExtraNormOp,optimization::common_expr_del::InNormOp>
                       (__v_00);
    if (vVar5 != *pvVar9) {
      pvVar8 = std::
               get<1ul,mir::inst::Op,optimization::common_expr_del::ExtraNormOp,optimization::common_expr_del::InNormOp>
                         (__v);
      vVar10 = *pvVar8;
      pvVar8 = std::
               get<1ul,mir::inst::Op,optimization::common_expr_del::ExtraNormOp,optimization::common_expr_del::InNormOp>
                         (__v_00);
      goto LAB_001273bf;
    }
  }
  else if (bVar1 == 0) {
    pvVar7 = std::
             get<0ul,mir::inst::Op,optimization::common_expr_del::ExtraNormOp,optimization::common_expr_del::InNormOp>
                       (__v);
    vVar4 = *pvVar7;
    pvVar7 = std::
             get<0ul,mir::inst::Op,optimization::common_expr_del::ExtraNormOp,optimization::common_expr_del::InNormOp>
                       (__v_00);
    if (vVar4 != *pvVar7) {
      pvVar8 = std::
               get<0ul,mir::inst::Op,optimization::common_expr_del::ExtraNormOp,optimization::common_expr_del::InNormOp>
                         (__v);
      vVar10 = *pvVar8;
      pvVar8 = std::
               get<0ul,mir::inst::Op,optimization::common_expr_del::ExtraNormOp,optimization::common_expr_del::InNormOp>
                         (__v_00);
LAB_001273bf:
      return (int)vVar10 < (int)*pvVar8;
    }
  }
  else {
    pvVar8 = std::
             get<2ul,mir::inst::Op,optimization::common_expr_del::ExtraNormOp,optimization::common_expr_del::InNormOp>
                       (__v);
    vVar10 = *pvVar8;
    pvVar8 = std::
             get<2ul,mir::inst::Op,optimization::common_expr_del::ExtraNormOp,optimization::common_expr_del::InNormOp>
                       (__v_00);
    if (vVar10 != *pvVar8) {
      pvVar8 = std::
               get<2ul,mir::inst::Op,optimization::common_expr_del::ExtraNormOp,optimization::common_expr_del::InNormOp>
                         (__v);
      vVar10 = *pvVar8;
      pvVar8 = std::
               get<2ul,mir::inst::Op,optimization::common_expr_del::ExtraNormOp,optimization::common_expr_del::InNormOp>
                         (__v_00);
      goto LAB_001273bf;
    }
  }
  _Var3 = *(__index_type *)
           ((long)&(this->op).
                   super__Variant_base<mir::inst::Op,_optimization::common_expr_del::ExtraNormOp,_optimization::common_expr_del::InNormOp>
                   .
                   super__Move_assign_alias<mir::inst::Op,_optimization::common_expr_del::ExtraNormOp,_optimization::common_expr_del::InNormOp>
                   .
                   super__Copy_assign_alias<mir::inst::Op,_optimization::common_expr_del::ExtraNormOp,_optimization::common_expr_del::InNormOp>
                   .
                   super__Move_ctor_alias<mir::inst::Op,_optimization::common_expr_del::ExtraNormOp,_optimization::common_expr_del::InNormOp>
                   .
                   super__Copy_ctor_alias<mir::inst::Op,_optimization::common_expr_del::ExtraNormOp,_optimization::common_expr_del::InNormOp>
                   .
                   super__Variant_storage_alias<mir::inst::Op,_optimization::common_expr_del::ExtraNormOp,_optimization::common_expr_del::InNormOp>
           + 4);
  if (_Var3 == '\0') {
    pvVar7 = std::
             get<0ul,mir::inst::Op,optimization::common_expr_del::ExtraNormOp,optimization::common_expr_del::InNormOp>
                       (__v);
    if ((*pvVar7 == Add) ||
       (pvVar7 = std::
                 get<0ul,mir::inst::Op,optimization::common_expr_del::ExtraNormOp,optimization::common_expr_del::InNormOp>
                           (__v), *pvVar7 == Mul)) {
      bVar6 = std::operator==(&this->operands,&other->operands);
      if (!bVar6) {
        std::
        vector<std::variant<int,_optimization::common_expr_del::NodeId,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::variant<int,_optimization::common_expr_del::NodeId,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ::vector(&local_40,&this->operands);
        std::
        __reverse<__gnu_cxx::__normal_iterator<std::variant<int,optimization::common_expr_del::NodeId,std::__cxx11::string>*,std::vector<std::variant<int,optimization::common_expr_del::NodeId,std::__cxx11::string>,std::allocator<std::variant<int,optimization::common_expr_del::NodeId,std::__cxx11::string>>>>>
                  (local_40.
                   super__Vector_base<std::variant<int,_optimization::common_expr_del::NodeId,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::variant<int,_optimization::common_expr_del::NodeId,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start,
                   local_40.
                   super__Vector_base<std::variant<int,_optimization::common_expr_del::NodeId,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::variant<int,_optimization::common_expr_del::NodeId,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish);
        bVar6 = std::operator==(&local_40,&other->operands);
        std::
        vector<std::variant<int,_optimization::common_expr_del::NodeId,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::variant<int,_optimization::common_expr_del::NodeId,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ::~vector(&local_40);
        if (!bVar6) goto LAB_0012739d;
      }
      return false;
    }
  }
  else if (_Var3 != '\x01') {
    __assert_fail("op.index() == 0 || op.index() == 1",
                  "/workspace/llm4binary/github/license_c_cmakelists/segviol[P]indigo/backend/optimization/common_expression_delete.hpp"
                  ,0x9f,"bool optimization::common_expr_del::Node::operator<(const Node &) const");
  }
LAB_0012739d:
  bVar6 = std::operator<(&this->operands,&other->operands);
  return bVar6;
}

Assistant:

bool operator<(const Node& other) const {
    if (is_leaf != other.is_leaf) {
      return is_leaf < other.is_leaf;
    }
    if (op.index() != other.op.index()) {
      return op.index() < other.op.index();
    }
    // same kind op
    if (op.index() == 0) {
      if (std::get<NormOp>(op) != std::get<NormOp>(other.op)) {
        return std::get<NormOp>(op) < std::get<NormOp>(other.op);
      }
    } else if (op.index() == 1) {
      if (std::get<ExtraNormOp>(op) != std::get<ExtraNormOp>(other.op)) {
        return std::get<ExtraNormOp>(op) < std::get<ExtraNormOp>(other.op);
      }
    } else {
      if (std::get<InNormOp>(op) != std::get<InNormOp>(other.op)) {
        return std::get<InNormOp>(op) < std::get<InNormOp>(other.op);
      }
    }
    assert(op.index() == 0 ||
           op.index() == 1);  // only Norm op is allowed to reuse the node
    // same op
    if (op.index() == 0) {
      if (std::get<NormOp>(op) == NormOp::Add ||
          std::get<NormOp>(op) == NormOp::Mul) {
        if (operands == other.operands) {
          return false;
        }
        std::vector<Operand> reverse_operands(operands);
        std::reverse(reverse_operands.begin(), reverse_operands.end());
        if (reverse_operands == other.operands) {
          return false;
        }
      }
    }

    return operands < other.operands;
  }